

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O3

void __thiscall QDateEdit::QDateEdit(QDateEdit *this,QDate date,QWidget *parent)

{
  QDate QVar1;
  undefined4 *puVar2;
  long in_FS_OFFSET;
  code *local_70;
  ImplFn local_68;
  QObject local_60 [8];
  QDate local_58;
  QVariant local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QVar1.jd = date.jd;
  if (0x16d3e147973 < date.jd + 0xb69eeff91fU) {
    QDate::QDate(&local_58,2000,1,1);
    QVar1.jd = local_58.jd;
  }
  local_58.jd = QVar1.jd;
  ::QVariant::QVariant(&local_50,local_58);
  QDateTimeEdit::QDateTimeEdit(&this->super_QDateTimeEdit,&local_50,QDate,parent);
  ::QVariant::~QVariant(&local_50);
  *(undefined ***)&(this->super_QDateTimeEdit).super_QAbstractSpinBox.super_QWidget =
       &PTR_metaObject_007f1380;
  *(undefined ***)
   &(this->super_QDateTimeEdit).super_QAbstractSpinBox.super_QWidget.super_QPaintDevice =
       &PTR__QDateEdit_007f1570;
  local_70 = userDateChanged;
  local_68 = (ImplFn)0x0;
  local_50.d.data.shared = (PrivateShared *)QDateTimeEdit::dateChanged;
  local_50.d.data._8_8_ = 0;
  puVar2 = (undefined4 *)operator_new(0x20);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::QCallableObject<void_(QDateEdit::*)(QDate),_QtPrivate::List<QDate>,_void>::impl;
  *(code **)(puVar2 + 4) = userDateChanged;
  *(undefined8 *)(puVar2 + 6) = 0;
  QObject::connectImpl
            (local_60,(void **)this,(QObject *)&local_50,(void **)this,(QSlotObjectBase *)&local_70,
             (ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QDateEdit::QDateEdit(QDate date, QWidget *parent)
    : QDateTimeEdit(date.isValid() ? date : QDATETIMEEDIT_DATE_INITIAL, QMetaType::QDate, parent)
{
    connect(this, &QDateEdit::dateChanged, this, &QDateEdit::userDateChanged);
}